

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DateFormatSymbols::createZoneStrings(DateFormatSymbols *this,UnicodeString **otherStrings)

{
  UnicodeString **ppUVar1;
  UnicodeString *pUVar2;
  UnicodeString *src;
  long lVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  src = (UnicodeString *)otherStrings;
  ppUVar1 = (UnicodeString **)uprv_malloc_63((long)this->fZoneStringsRowCount << 3);
  this->fZoneStrings = ppUVar1;
  if (ppUVar1 != (UnicodeString **)0x0) {
    for (uVar5 = 0; (long)uVar5 < (long)this->fZoneStringsRowCount; uVar5 = uVar5 + 1) {
      pUVar2 = newUnicodeStringArray((long)this->fZoneStringsColCount);
      this->fZoneStrings[uVar5] = pUVar2;
      if (this->fZoneStrings[uVar5] == (UnicodeString *)0x0) {
        while( true ) {
          if ((int)uVar5 < 0) break;
          pUVar2 = this->fZoneStrings[uVar5 & 0xffffffff];
          if (pUVar2 != (UnicodeString *)0x0) {
            lVar3 = *(long *)((long)&pUVar2[-1].fUnion + 0x30);
            if (lVar3 != 0) {
              lVar3 = lVar3 << 6;
              do {
                icu_63::UnicodeString::~UnicodeString
                          ((UnicodeString *)
                           ((long)&pUVar2[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3)
                          );
                lVar3 = lVar3 + -0x40;
              } while (lVar3 != 0);
            }
            UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),src);
          }
          uVar5 = (ulong)((int)uVar5 - 1);
        }
        uprv_free_63(this->fZoneStrings);
        this->fZoneStrings = (UnicodeString **)0x0;
        return;
      }
      lVar3 = 0;
      for (lVar4 = 0; lVar4 < this->fZoneStringsColCount; lVar4 = lVar4 + 1) {
        src = (UnicodeString *)
              ((long)&(otherStrings[uVar5]->super_Replaceable).super_UObject._vptr_UObject + lVar3);
        icu_63::UnicodeString::fastCopyFrom
                  ((UnicodeString *)
                   ((long)&(this->fZoneStrings[uVar5]->super_Replaceable).super_UObject.
                           _vptr_UObject + lVar3),src);
        lVar3 = lVar3 + 0x40;
      }
    }
  }
  return;
}

Assistant:

void
DateFormatSymbols::createZoneStrings(const UnicodeString *const * otherStrings)
{
    int32_t row, col;
    UBool failed = FALSE;

    fZoneStrings = (UnicodeString **)uprv_malloc(fZoneStringsRowCount * sizeof(UnicodeString *));
    if (fZoneStrings != NULL) {
        for (row=0; row<fZoneStringsRowCount; ++row)
        {
            fZoneStrings[row] = newUnicodeStringArray(fZoneStringsColCount);
            if (fZoneStrings[row] == NULL) {
                failed = TRUE;
                break;
            }
            for (col=0; col<fZoneStringsColCount; ++col) {
                // fastCopyFrom() - see assignArray comments
                fZoneStrings[row][col].fastCopyFrom(otherStrings[row][col]);
            }
        }
    }
    // If memory allocation failed, roll back and delete fZoneStrings
    if (failed) {
        for (int i = row; i >= 0; i--) {
            delete[] fZoneStrings[i];
        }
        uprv_free(fZoneStrings);
        fZoneStrings = NULL;
    }
}